

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

nn_optset * nn_tcp_optset(void)

{
  nn_optset *pnVar1;
  
  pnVar1 = (nn_optset *)nn_alloc_(0x10);
  if (pnVar1 != (nn_optset *)0x0) {
    pnVar1->vfptr = &nn_tcp_optset_vfptr;
    *(undefined4 *)&pnVar1[1].vfptr = 0;
    return pnVar1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/tcp.c"
          ,0x5e);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static struct nn_optset *nn_tcp_optset ()
{
    struct nn_tcp_optset *optset;

    optset = nn_alloc (sizeof (struct nn_tcp_optset), "optset (tcp)");
    alloc_assert (optset);
    optset->base.vfptr = &nn_tcp_optset_vfptr;

    /*  Default values for TCP socket options. */
    optset->nodelay = 0;

    return &optset->base;   
}